

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node256_leaf.cpp
# Opt level: O2

void duckdb::Node256Leaf::DeleteByte(ART *art,Node *node,uint8_t byte)

{
  Node256Leaf *pNVar1;
  undefined7 in_register_00000011;
  Node node256;
  ValidityMask mask;
  
  pNVar1 = Node::Ref<duckdb::Node256Leaf>(art,(Node)(node->super_IndexPointer).data,NODE_256_LEAF);
  pNVar1->count = pNVar1->count - 1;
  mask.super_TemplatedValidityMask<unsigned_long>.validity_mask = pNVar1->mask;
  mask.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  mask.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  mask.super_TemplatedValidityMask<unsigned_long>.capacity = 0x100;
  TemplatedValidityMask<unsigned_long>::SetInvalid
            (&mask.super_TemplatedValidityMask<unsigned_long>,
             CONCAT71(in_register_00000011,byte) & 0xffffffff);
  if (pNVar1->count < 0xd) {
    node256 = (Node)(node->super_IndexPointer).data;
    Node15Leaf::ShrinkNode256Leaf(art,node,&node256);
  }
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&mask.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

void Node256Leaf::DeleteByte(ART &art, Node &node, const uint8_t byte) {
	auto &n256 = Node::Ref<Node256Leaf>(art, node, NODE_256_LEAF);
	n256.count--;
	ValidityMask mask(&n256.mask[0], Node256::CAPACITY);
	mask.SetInvalid(byte);

	// Shrink node to Node15
	if (n256.count <= Node48::SHRINK_THRESHOLD) {
		auto node256 = node;
		Node15Leaf::ShrinkNode256Leaf(art, node, node256);
	}
}